

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,int64_t size)

{
  complex<double> *__s;
  ulong __n;
  
  this->size_ = size;
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                  ,0x12,
                  "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<double>]")
    ;
  }
  __n = size * size * 0x10;
  __s = (complex<double> *)operator_new__(-(ulong)((ulong)(size * size) >> 0x3c != 0) | __n);
  memset(__s,0,__n);
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = __s;
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0x2d,
                "qclab::dense::SquareMatrix<std::complex<double>>::SquareMatrix(const int64_t) [T = std::complex<double>]"
               );
}

Assistant:

SquareMatrix( const int64_t size )
        : size_( size )
        , data_( alloc_unique_array< T >( size * size ) )
        {
          assert( size > 0 ) ;
        }